

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O0

void __thiscall
MPLSStreamInfo::composeStreamAttributes(MPLSStreamInfo *this,BitStreamWriter *writer)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint8_t *puVar5;
  VodCoreException *this_00;
  string local_1d0;
  ostringstream local_1a0 [8];
  ostringstream ss;
  int initPos;
  uint8_t *lengthPos;
  BitStreamWriter *writer_local;
  MPLSStreamInfo *this_local;
  
  puVar5 = BitStream::getBuffer(&writer->super_BitStream);
  iVar2 = BitStreamWriter::getBitsCount(writer);
  BitStreamWriter::putBits(writer,8,0);
  iVar3 = BitStreamWriter::getBitsCount(writer);
  BitStreamWriter::putBits(writer,8,(this->super_M2TSStreamInfo).stream_coding_type);
  bVar1 = isVideoStreamType((this->super_M2TSStreamInfo).stream_coding_type);
  if (bVar1) {
    BitStreamWriter::putBits(writer,4,(uint)(this->super_M2TSStreamInfo).video_format);
    BitStreamWriter::putBits(writer,4,(uint)(this->super_M2TSStreamInfo).frame_rate_index);
    if (((this->super_M2TSStreamInfo).HDR & 0x12U) == 0) {
      if ((this->super_M2TSStreamInfo).HDR == 4) {
        BitStreamWriter::putBits(writer,8,0x22);
      }
      else {
        BitStreamWriter::putBits(writer,8,0);
      }
    }
    else {
      BitStreamWriter::putBits(writer,8,0x12);
    }
    if ((this->super_M2TSStreamInfo).HDR == 0x10) {
      BitStreamWriter::putBits(writer,8,0x40);
    }
    else {
      BitStreamWriter::putBits(writer,8,0);
    }
    BitStreamWriter::putBits(writer,8,0);
  }
  else {
    bVar1 = isAudioStreamType((this->super_M2TSStreamInfo).stream_coding_type);
    if (bVar1) {
      BitStreamWriter::putBits(writer,4,(uint)(this->super_M2TSStreamInfo).audio_presentation_type);
      BitStreamWriter::putBits(writer,4,(uint)(this->super_M2TSStreamInfo).sampling_frequency_index)
      ;
      CLPIStreamInfo::writeString((this->super_M2TSStreamInfo).language_code,writer,3);
    }
    else {
      if ((this->super_M2TSStreamInfo).stream_coding_type != SUB_PGS) {
        std::__cxx11::ostringstream::ostringstream(local_1a0);
        std::operator<<((ostream *)local_1a0,"Unsupported media type for AVCHD/Blu-ray muxing");
        this_00 = (VodCoreException *)__cxa_allocate_exception(0x28);
        std::__cxx11::ostringstream::str();
        VodCoreException::VodCoreException(this_00,3,&local_1d0);
        __cxa_throw(this_00,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
      }
      CLPIStreamInfo::writeString((this->super_M2TSStreamInfo).language_code,writer,3);
      BitStreamWriter::putBits(writer,8,0);
    }
  }
  iVar4 = BitStreamWriter::getBitsCount(writer);
  puVar5[iVar2 / 8] = (char)(iVar4 / 8) - (char)(iVar3 / 8);
  return;
}

Assistant:

void MPLSStreamInfo::composeStreamAttributes(BitStreamWriter& writer)
{
    uint8_t* lengthPos = writer.getBuffer() + writer.getBitsCount() / 8;
    writer.putBits(8, 0);  // length
    const int initPos = writer.getBitsCount() / 8;

    writer.putBits(8, static_cast<int>(stream_coding_type));
    if (isVideoStreamType(stream_coding_type))
    {
        writer.putBits(4, video_format);
        writer.putBits(4, frame_rate_index);
        if (HDR & 18)
            writer.putBits(8, 0x12);  // HDR10 or HDR10plus
        else if (HDR == 4)
            writer.putBits(8, 0x22);  // DV
        else
            writer.putBits(8, 0);
        if (HDR == 16)
            writer.putBits(8, 0x40);  // HDR10plus
        else
            writer.putBits(8, 0);
        writer.putBits(8, 0);  // reserved_for_future_use
    }
    else if (isAudioStreamType(stream_coding_type))
    {
        writer.putBits(4, audio_presentation_type);
        writer.putBits(4, sampling_frequency_index);
        CLPIStreamInfo::writeString(language_code, writer, 3);
    }
    else if (stream_coding_type == StreamType::SUB_PGS)
    {
        // Presentation Graphics stream
        CLPIStreamInfo::writeString(language_code, writer, 3);
        writer.putBits(8, 0);  // reserved_for_future_use
    }
    else
        THROW(ERR_COMMON, "Unsupported media type for AVCHD/Blu-ray muxing")
    *lengthPos = static_cast<uint8_t>(writer.getBitsCount() / 8 - initPos);
}